

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

void __thiscall embree::TutorialBenchmark::TutorialBenchmark(TutorialBenchmark *this,BenchFunc func)

{
  CommandLineParser *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_class_8_1_8991fb9c_for_f local_80;
  string local_78;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->_vptr_TutorialBenchmark = (_func_int **)&PTR_postParseCommandLine_002e7f68;
  this_00 = &this->commandLineParser;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0;
  (this->commandLineParser).verbosity = SILENT;
  paVar2 = &(this->inputFile).field_2;
  (this->inputFile)._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->inputFile,"");
  (this->processedCommandLineOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->params).skipIterations = 0;
  (this->params).minTimeOrIterations = 0;
  (this->processedCommandLineOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processedCommandLineOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)((long)&(this->params).minTimeOrIterations + 1) = 0;
  (this->params).name._M_dataplus._M_p = (pointer)&(this->params).name.field_2;
  (this->params).name._M_string_length = 0;
  (this->params).name.field_2._M_local_buf[0] = '\0';
  this->func = func;
  paVar3 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar3;
  local_38 = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"help","");
  paVar2 = &local_78.field_2;
  local_80.this = this;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"--help: prints help for all supported command line options","");
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_1_>
            (this_00,&local_58,&local_80,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"i","");
  local_80.this = this;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-i <filepath>: .xml ","");
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_2_>
            (this_00,&local_58,(anon_class_8_1_8991fb9c_for_f *)&local_80,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"c","");
  local_80.this = this;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"-c <filepath>: .ecs ","");
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_3_>
            (this_00,&local_58,(anon_class_8_1_8991fb9c_for_f *)&local_80,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"benchmark","");
  local_80.this = this;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "--benchmark <N> <M>: run benchmark for M seconds (M iterations in legacy mode) with N iterations warm-up"
             ,"");
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_4_>
            (this_00,&local_58,(anon_class_8_1_8991fb9c_for_f *)&local_80,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"legacy","");
  local_80.this = this;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"--legacy: run old benchmark version (without google benchmark)",""
            );
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_5_>
            (this_00,&local_58,(anon_class_8_1_8991fb9c_for_f *)&local_80,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"benchmark_repetitions","");
  local_80.this = this;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "--benchmark_repetitions <R>: run R repetitions when using google benchmark","");
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_6_>
            (this_00,&local_58,(anon_class_8_1_8991fb9c_for_f *)&local_80,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"benchmark_name","");
  local_80.this = this;
  local_78._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"--benchmark_name <string>: override name of the benchmark","");
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_7_>
            (this_00,&local_58,(anon_class_8_1_8991fb9c_for_f *)&local_80,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar3) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

TutorialBenchmark(BenchFunc func) :
    commandLineParser(CommandLineParser(CommandLineParser::SILENT)),
    func(func)
  {
    commandLineParser.registerOption("help", [this] (Ref<ParseStream> cin, const FileName& path) {
        commandLineParser.printCommandLineHelp();
        exit(1);
      }, "--help: prints help for all supported command line options");
    commandLineParser.registerOption("i", [&] (Ref<ParseStream> cin, const FileName& path) {
        inputFile = cin->getString();
      }, "-i <filepath>: .xml ");
    commandLineParser.registerOption("c", [&] (Ref<ParseStream> cin, const FileName& path) {
        inputFile = cin->getString();
      }, "-c <filepath>: .ecs ");
    commandLineParser.registerOption("benchmark", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.skipIterations = cin->getInt();
        params.minTimeOrIterations = cin->getInt();
        processedCommandLineOptions.push_back("--benchmark");
      }, "--benchmark <N> <M>: run benchmark for M seconds (M iterations in legacy mode) with N iterations warm-up");
    commandLineParser.registerOption("legacy", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.legacy = true;
        processedCommandLineOptions.push_back("--legacy");
      }, "--legacy: run old benchmark version (without google benchmark)");
    commandLineParser.registerOption("benchmark_repetitions", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.repetitions = cin->getInt();
        processedCommandLineOptions.push_back("--benchmark_repetitions");
      }, "--benchmark_repetitions <R>: run R repetitions when using google benchmark");
    commandLineParser.registerOption("benchmark_name", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.name = cin->getString();
        processedCommandLineOptions.push_back("--benchmark_name");
      }, "--benchmark_name <string>: override name of the benchmark");
  }